

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BayesianProbitRegressor.pb.cc
# Opt level: O2

void __thiscall
CoreML::Specification::BayesianProbitRegressor_FeatureValueWeight::
BayesianProbitRegressor_FeatureValueWeight
          (BayesianProbitRegressor_FeatureValueWeight *this,
          BayesianProbitRegressor_FeatureValueWeight *from)

{
  BayesianProbitRegressor_Gaussian *from_00;
  BayesianProbitRegressor_Gaussian *this_00;
  
  (this->super_MessageLite)._internal_metadata_.ptr_ = 0;
  (this->super_MessageLite)._vptr_MessageLite =
       (_func_int **)&PTR__BayesianProbitRegressor_FeatureValueWeight_00405748;
  (this->_cached_size_).size_.super___atomic_base<int>._M_i = 0;
  google::protobuf::internal::InternalMetadata::MergeFrom<std::__cxx11::string>
            (&(this->super_MessageLite)._internal_metadata_,
             &(from->super_MessageLite)._internal_metadata_);
  from_00 = from->featureweight_;
  if (from_00 == (BayesianProbitRegressor_Gaussian *)0x0 ||
      from == (BayesianProbitRegressor_FeatureValueWeight *)
              _BayesianProbitRegressor_FeatureValueWeight_default_instance_) {
    this_00 = (BayesianProbitRegressor_Gaussian *)0x0;
  }
  else {
    this_00 = (BayesianProbitRegressor_Gaussian *)operator_new(0x28);
    BayesianProbitRegressor_Gaussian::BayesianProbitRegressor_Gaussian(this_00,from_00);
  }
  this->featureweight_ = this_00;
  this->featurevalue_ = from->featurevalue_;
  return;
}

Assistant:

BayesianProbitRegressor_FeatureValueWeight::BayesianProbitRegressor_FeatureValueWeight(const BayesianProbitRegressor_FeatureValueWeight& from)
  : ::PROTOBUF_NAMESPACE_ID::MessageLite() {
  _internal_metadata_.MergeFrom<std::string>(from._internal_metadata_);
  if (from._internal_has_featureweight()) {
    featureweight_ = new ::CoreML::Specification::BayesianProbitRegressor_Gaussian(*from.featureweight_);
  } else {
    featureweight_ = nullptr;
  }
  featurevalue_ = from.featurevalue_;
  // @@protoc_insertion_point(copy_constructor:CoreML.Specification.BayesianProbitRegressor.FeatureValueWeight)
}